

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

void volkFinalize(void)

{
  if (loadedModule != (void *)0x0) {
    dlclose(loadedModule);
  }
  vkGetInstanceProcAddr = (PFN_vkGetInstanceProcAddr)0x0;
  volkGenLoadLoader((void *)0x0,nullProcAddrStub);
  volkGenLoadInstance((void *)0x0,nullProcAddrStub);
  volkGenLoadDevice((void *)0x0,nullProcAddrStub);
  loadedModule = (void *)0x0;
  loadedInstance = (VkInstance)0x0;
  loadedDevice = (VkDevice)0x0;
  return;
}

Assistant:

void volkFinalize(void)
{
	if (loadedModule)
	{
#if defined(_WIN32)
		FreeLibrary((HMODULE)loadedModule);
#else
		dlclose(loadedModule);
#endif
	}

	vkGetInstanceProcAddr = NULL;
	volkGenLoadLoader(NULL, nullProcAddrStub);
	volkGenLoadInstance(NULL, nullProcAddrStub);
	volkGenLoadDevice(NULL, nullProcAddrStub);

	loadedModule = NULL;
	loadedInstance = VK_NULL_HANDLE;
	loadedDevice = VK_NULL_HANDLE;
}